

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  pointer *ppTVar1;
  byte bVar2;
  uint uVar3;
  float fVar4;
  pointer pTVar5;
  pointer pTVar6;
  char cVar7;
  uint uVar8;
  size_type sVar9;
  bool bVar10;
  int iVar11;
  undefined7 uVar14;
  size_t sVar12;
  undefined8 uVar13;
  char *pcVar15;
  string *psVar16;
  long lVar17;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_name;
  string attr_type;
  size_t marker_size;
  EXRAttribute attrib;
  int local_344;
  undefined1 local_338 [16];
  pointer local_328;
  EXRVersion *local_318;
  string local_310;
  ulong local_2f0;
  string *local_2e8;
  string *local_2e0;
  string *local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  string local_288;
  iterator local_268;
  pointer local_260;
  vector<TEXRAttribute,std::allocator<TEXRAttribute>> *local_258;
  size_t local_250;
  size_t local_248;
  TEXRAttribute local_240;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if (((size == 0) || (version->multipart == 0)) || (*buf != '\0')) {
    (info->name)._M_string_length = 0;
    *(info->name)._M_dataplus._M_p = '\0';
    (info->type)._M_string_length = 0;
    *(info->type)._M_dataplus._M_p = '\0';
    (info->display_window).max_x = 0;
    (info->display_window).max_y = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    (info->display_window).min_x = 0;
    (info->display_window).min_y = 0;
    (info->display_window).max_x = 0;
    (info->data_window).min_x = 0;
    (info->data_window).min_y = 0;
    (info->data_window).max_x = 0;
    (info->data_window).max_y = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tiled = 0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    pTVar5 = (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != pTVar5) {
      (info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar5;
    }
    local_2d8 = &info->name;
    local_2e0 = &info->type;
    local_258 = (vector<TEXRAttribute,std::allocator<TEXRAttribute>> *)&info->attributes;
    lVar17 = 0x400;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_298 = 0;
    local_2f0 = 0;
    local_290 = 0;
    local_318 = version;
    local_2e8 = err;
    local_250 = size;
    do {
      psVar16 = local_2e8;
      if (size == 0) {
        if (local_2e8 == (string *)0x0) {
          return -4;
        }
        std::__cxx11::string::append((char *)local_2e8);
        return -4;
      }
      if (*buf == '\0') {
        size = size - 1;
        break;
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      local_310._M_string_length = 0;
      local_310.field_2._M_local_buf[0] = '\0';
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
      local_328 = (pointer)0x0;
      local_338 = (undefined1  [16])0x0;
      bVar10 = ReadAttribute(&local_310,&local_288,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338,
                             &local_248,(char *)buf,size);
      if (bVar10) {
        buf = buf + local_248;
        size = size - local_248;
        if ((((local_318->tiled != 0) || (local_318->multipart != 0)) || (local_318->non_image != 0)
            ) && (iVar11 = std::__cxx11::string::compare((char *)&local_310), iVar11 == 0)) {
          if (local_338._8_8_ - local_338._0_8_ == 9) {
            uVar3 = *(uint *)(local_338._0_8_ + 4);
            if (-1 < (int)(*(uint *)local_338._0_8_ | uVar3)) {
              uVar8 = *(uint *)(local_338._0_8_ + 8);
              info->tile_size_x = *(uint *)local_338._0_8_;
              info->tile_size_y = uVar3;
              info->tile_level_mode = (byte)uVar8 & 3;
              info->tile_rounding_mode = (byte)((byte)uVar8 >> 4) & 1;
              info->tiled = 1;
              goto LAB_001c57de;
            }
            local_344 = -8;
            if (psVar16 != (string *)0x0) {
              bVar10 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)psVar16,0,(char *)psVar16->_M_string_length,0x255918);
              goto LAB_001c57e1;
            }
          }
          else {
            local_344 = -4;
            if (psVar16 != (string *)0x0) {
              std::__cxx11::string::append((char *)psVar16);
            }
          }
          goto LAB_001c5512;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_310);
        if (iVar11 == 0) {
          bVar2 = *(byte *)local_338._0_8_;
          if (bVar2 < 5) {
            info->compression_type = (uint)bVar2;
            local_2f0 = 1;
            goto LAB_001c57de;
          }
          if (bVar2 == 0x80) {
            pcVar15 = "ZFP compression is not supported.";
          }
          else {
            pcVar15 = "Unknown compression type.";
          }
          if (psVar16 != (string *)0x0) {
            bVar10 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)psVar16,0,(char *)psVar16->_M_string_length,(ulong)pcVar15);
            local_344 = -8;
            goto LAB_001c57e1;
          }
          local_344 = -8;
          goto LAB_001c5512;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_310);
        if (iVar11 == 0) {
          bVar10 = ReadChannelInfo(&info->channels,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_338);
          if (bVar10) {
            pTVar6 = (info->channels).
                     super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar10 = true;
            psVar16 = local_2e8;
            if (pTVar6 != (info->channels).
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
              local_290 = CONCAT71((int7)((ulong)pTVar6 >> 8),1);
              goto LAB_001c57e1;
            }
          }
          if (psVar16 != (string *)0x0) {
            std::__cxx11::string::append((char *)psVar16);
          }
          local_344 = -4;
          goto LAB_001c5512;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_310);
        if (iVar11 == 0) {
          bVar10 = true;
          if ((ulong)(local_338._8_8_ - local_338._0_8_) < 0x10) goto LAB_001c57e1;
          (info->data_window).min_x = *(int *)local_338._0_8_;
          (info->data_window).min_y = *(int *)(local_338._0_8_ + 4);
          (info->data_window).max_x = *(int *)(local_338._0_8_ + 8);
          iVar11 = *(int *)(local_338._0_8_ + 0xc);
          (info->data_window).max_y = iVar11;
          local_298 = CONCAT71((uint7)(uint3)((uint)iVar11 >> 8),1);
LAB_001c57de:
          bVar10 = true;
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)&local_310);
          if (iVar11 == 0) {
            bVar10 = true;
            if ((ulong)(local_338._8_8_ - local_338._0_8_) < 0x10) goto LAB_001c57e1;
            (info->display_window).min_x = *(int *)local_338._0_8_;
            (info->display_window).min_y = *(int *)(local_338._0_8_ + 4);
            (info->display_window).max_x = *(int *)(local_338._0_8_ + 8);
            iVar11 = *(int *)(local_338._0_8_ + 0xc);
            (info->display_window).max_y = iVar11;
            local_2a0 = CONCAT71((uint7)(uint3)((uint)iVar11 >> 8),1);
            goto LAB_001c57de;
          }
          iVar11 = std::__cxx11::string::compare((char *)&local_310);
          if (iVar11 == 0) {
            if (local_338._8_8_ != local_338._0_8_) {
              info->line_order = (uint)*(byte *)local_338._0_8_;
              local_2a8 = 1;
            }
            goto LAB_001c57de;
          }
          iVar11 = std::__cxx11::string::compare((char *)&local_310);
          if (iVar11 == 0) {
            bVar10 = true;
            if (3 < (ulong)(local_338._8_8_ - local_338._0_8_)) {
              fVar4 = *(float *)local_338._0_8_;
              info->pixel_aspect_ratio = fVar4;
              local_2b0 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
              goto LAB_001c57de;
            }
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_310);
            if (iVar11 == 0) {
              bVar10 = true;
              if (7 < (ulong)(local_338._8_8_ - local_338._0_8_)) {
                info->screen_window_center[0] = *(float *)local_338._0_8_;
                fVar4 = *(float *)(local_338._0_8_ + 4);
                info->screen_window_center[1] = fVar4;
                local_2b8 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
                goto LAB_001c57de;
              }
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_310);
              if (iVar11 == 0) {
                bVar10 = true;
                if (3 < (ulong)(local_338._8_8_ - local_338._0_8_)) {
                  fVar4 = *(float *)local_338._0_8_;
                  info->screen_window_width = fVar4;
                  local_2c0 = CONCAT71((uint7)(uint3)((uint)fVar4 >> 8),1);
                  goto LAB_001c57de;
                }
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)&local_310);
                if (iVar11 == 0) {
                  bVar10 = true;
                  if (3 < (ulong)(local_338._8_8_ - local_338._0_8_)) {
                    info->chunk_count = *(int *)local_338._0_8_;
                  }
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)&local_310);
                  uVar14 = (undefined7)((ulong)info >> 8);
                  if (iVar11 == 0) {
                    bVar10 = true;
                    if ((local_338._0_8_ != local_338._8_8_) && (*(uchar *)local_338._0_8_ != '\0'))
                    {
                      local_240.name[0] = '\0';
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_338,
                                 (value_type_conflict3 *)&local_240);
                      sVar12 = strlen((char *)local_338._0_8_);
                      std::__cxx11::string::resize((ulong)local_2d8,(char)sVar12);
                      local_2c8 = CONCAT71(uVar14,1);
                      std::__cxx11::string::_M_replace
                                ((ulong)local_2d8,0,(char *)(info->name)._M_string_length,
                                 local_338._0_8_);
                      bVar10 = true;
                    }
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)&local_310);
                    if (iVar11 == 0) {
                      bVar10 = true;
                      if ((local_338._0_8_ != local_338._8_8_) &&
                         (*(uchar *)local_338._0_8_ != '\0')) {
                        local_240.name[0] = '\0';
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_338,(value_type_conflict3 *)&local_240);
                        sVar12 = strlen((char *)local_338._0_8_);
                        std::__cxx11::string::resize((ulong)local_2e0,(char)sVar12);
                        local_2d0 = CONCAT71(uVar14,1);
                        std::__cxx11::string::_M_replace
                                  ((ulong)local_2e0,0,(char *)(info->type)._M_string_length,
                                   local_338._0_8_);
                        bVar10 = true;
                      }
                    }
                    else {
                      pTVar5 = (info->attributes).
                               super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                      bVar10 = true;
                      if ((ulong)(((long)pTVar5 -
                                   (long)(info->attributes).
                                         super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 0xf83e0f83e0f83e1) < 0x80) {
                        local_268._M_current = pTVar5;
                        strncpy(local_240.name,local_310._M_dataplus._M_p,0xff);
                        strncpy(local_240.type,local_288._M_dataplus._M_p,0xff);
                        local_240.name[0xff] = '\0';
                        local_240.type[0xff] = '\0';
                        local_260 = (pointer)local_338._0_8_;
                        uVar13 = local_338._8_8_;
                        local_240.size = (int)(local_338._8_8_ - local_338._0_8_);
                        local_240.value = (uchar *)malloc(local_338._8_8_ - local_338._0_8_);
                        if (uVar13 - (long)local_260 == 0) {
                          uVar13 = std::__throw_out_of_range_fmt
                                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                              ,0,0);
                          if ((pointer)local_338._0_8_ != (pointer)0x0) {
                            operator_delete((void *)local_338._0_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_288._M_dataplus._M_p != &local_288.field_2) {
                            operator_delete(local_288._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_310._M_dataplus._M_p != &local_310.field_2) {
                            operator_delete(local_310._M_dataplus._M_p);
                          }
                          _Unwind_Resume(uVar13);
                        }
                        memcpy(local_240.value,local_260,uVar13 - (long)local_260);
                        if (local_268._M_current ==
                            (info->attributes).
                            super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<TEXRAttribute,std::allocator<TEXRAttribute>>::
                          _M_realloc_insert<TEXRAttribute_const&>(local_258,local_268,&local_240);
                        }
                        else {
                          memcpy(local_268._M_current,&local_240,0x210);
                          ppTVar1 = &(info->attributes).
                                     super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          *ppTVar1 = *ppTVar1 + 1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        local_344 = -4;
        if (psVar16 != (string *)0x0) {
          std::__cxx11::string::append((char *)psVar16);
        }
LAB_001c5512:
        bVar10 = false;
      }
LAB_001c57e1:
      if ((pointer)local_338._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_338._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if (!bVar10) {
        return local_344;
      }
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    psVar16 = local_2e8;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
    if ((local_2f0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"compression\" attribute not found in the header.",0x30);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_290 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"channels\" attribute not found in the header.",0x2d);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_2a8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"lineOrder\" attribute not found in the header.",0x2e);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_2a0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"displayWindow\" attribute not found in the header.",0x32);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_298 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"dataWindow\" attribute not found in the header or invalid.",0x3a);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_2b0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"pixelAspectRatio\" attribute not found in the header.",0x35);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_2c0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"screenWindowWidth\" attribute not found in the header.",0x36);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_2b8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"screenWindowCenter\" attribute not found in the header.",0x37);
      cVar7 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if ((local_318->multipart != 0) || (local_318->non_image != 0)) {
      if ((local_2c8 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),"\"name\" attribute not found in the header.",
                   0x29);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if ((local_2d0 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_240.name + 0x10),"\"type\" attribute not found in the header.",
                   0x29);
        cVar7 = (char)(ostream *)(local_240.name + 0x10);
        std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
    }
    std::__cxx11::stringbuf::str();
    sVar9 = local_310._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    iVar11 = -9;
    if (sVar9 == 0) {
      iVar11 = local_344;
    }
    if (sVar9 != 0 && psVar16 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_310._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      iVar11 = -9;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
    std::ios_base::~ios_base((ios_base *)(local_240.name + 0x80));
    if (sVar9 == 0) {
      info->header_len = (int)local_250 - (int)size;
      iVar11 = 0;
    }
  }
  else {
    iVar11 = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return iVar11;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;
  bool has_name = false;
  bool has_type = false;

  info->name.clear();
  info->type.clear();

  info->data_window.min_x = 0;
  info->data_window.min_y = 0;
  info->data_window.max_x = 0;
  info->data_window.max_y = 0;
  info->line_order = 0;  // @fixme
  info->display_window.min_x = 0;
  info->display_window.min_y = 0;
  info->display_window.max_x = 0;
  info->display_window.max_y = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tiled = 0;
  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    // For a multipart file, the version field 9th bit is 0.
    if ((version->tiled || version->multipart || version->non_image) && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      if (data.size() != 9) {
        if (err) {
          (*err) += "(ParseEXRHeader) Invalid attribute data size. Attribute data size must be 9.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      if (x_size > static_cast<unsigned int>(std::numeric_limits<int>::max()) ||
          y_size > static_cast<unsigned int>(std::numeric_limits<int>::max())) {
        if (err) {
          (*err) = "Tile sizes were invalid.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;
      info->tiled = 1;
    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->data_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->data_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->data_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->data_window.min_x);
        tinyexr::swap4(&info->data_window.min_y);
        tinyexr::swap4(&info->data_window.max_x);
        tinyexr::swap4(&info->data_window.max_y);
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->display_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->display_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->display_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->display_window.min_x);
        tinyexr::swap4(&info->display_window.min_y);
        tinyexr::swap4(&info->display_window.max_x);
        tinyexr::swap4(&info->display_window.max_y);

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->pixel_aspect_ratio);
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(&info->screen_window_center[0]);
        tinyexr::swap4(&info->screen_window_center[1]);
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->screen_window_width);

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(&info->chunk_count);
      }
    } else if (attr_name.compare("name") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->name.resize(len);
        info->name.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_name = true;
      }
    } else if (attr_name.compare("type") == 0) {
      if (!data.empty() && data[0]) {
        data.push_back(0);
        size_t len = strlen(reinterpret_cast<const char*>(&data[0]));
        info->type.resize(len);
        info->type.assign(reinterpret_cast<const char*>(&data[0]), len);
        has_type = true;
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        //std::cout << "i = " << info->attributes.size() << ", dsize = " << data.size() << "\n";
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (version->multipart || version->non_image) {
      if (!has_name) {
        ss_err << "\"name\" attribute not found in the header."
          << std::endl;
      }
      if (!has_type) {
        ss_err << "\"type\" attribute not found in the header."
          << std::endl;
      }
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }

      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}